

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void walk_ports_recurse(Port *p,char *name_buffer,size_t buffer_size,Ports *base,void *data,
                       port_walker_t walker,void *runtime,char *old_end,bool expand_bundles,
                       bool ranges)

{
  bool bVar1;
  size_t sVar2;
  void *runtime_00;
  char *local_8b8;
  RtData r;
  char buf [1024];
  char locbuf [1024];
  
  if (runtime == (void *)0x0) {
    runtime_00 = (void *)0x0;
  }
  else {
    memset(buf,0,0x400);
    fast_strcpy(buf,name_buffer,0x400);
    sVar2 = strlen(buf);
    strncat(buf,"pointer",0x3ff - sVar2);
    sVar2 = strlen(buf);
    fast_strcpy(buf + sVar2 + 1,",",2);
    fast_strcpy(locbuf,name_buffer,0x400);
    rtosc::RtData::RtData(&r);
    r.obj = runtime;
    r.loc_size = 0x400;
    local_8b8 = old_end + (long)(buf + -(long)name_buffer);
    r.loc = locbuf;
    r.port = p;
    r.message = buf;
    if ((p->cb).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(p->cb)._M_invoker)((_Any_data *)&p->cb,&local_8b8,&r);
    if (r.obj == (void *)0x0) {
      return;
    }
    bVar1 = port_is_enabled(p,name_buffer,buffer_size,base,runtime,true,walker,data);
    runtime_00 = r.obj;
    if (!bVar1) {
      return;
    }
  }
  rtosc::walk_ports(p->ports,name_buffer,buffer_size,data,walker,expand_bundles,runtime_00,ranges);
  return;
}

Assistant:

static void walk_ports_recurse(const Port& p, char* name_buffer,
                               size_t buffer_size, const Ports& base,
                               void* data, port_walker_t walker,
                               void* runtime, const char* old_end,
                               bool expand_bundles, bool ranges)
{
    // TODO: all/most of these checks must also be done for the
    // first, non-recursive call
    bool enabled = true;
    if(runtime)
    {
        // get child runtime and check if it's NULL

        assert(old_end >= name_buffer);
        assert(old_end - name_buffer <= 255);

        const char* buf_ptr;
        char buf[1024] = "";
        fast_strcpy(buf, name_buffer, sizeof(buf));
        // there is no "pointer" callback. thus, there will be nothing
        // dispatched, but the rRecur*Cb already have set r.obj
        // that way, we get our pointer
        strncat(buf, "pointer", sizeof(buf) - strlen(buf) - 1);
        assert(1024 - strlen(buf) >= 8);
        fast_strcpy(buf + strlen(buf) + 1, ",", 2);

        buf_ptr = buf + (old_end - name_buffer);

        char locbuf[1024];
        fast_strcpy(locbuf, name_buffer, sizeof(locbuf));
        RtData r;
        r.obj = runtime; // runtime object of the port that contains p
        r.port = &p;
        r.message = buf;
        r.loc = locbuf;
        r.loc_size = sizeof(locbuf);

        p.cb(buf_ptr, r); // call "pointer" callback (see above)
        // if there is runtime information (see above), but this pointer
        // is NULL, the port is not enabled
        enabled = (bool) r.obj; // r.obj = the next runtime object
        if(enabled)
        {
            // check if the port is disabled by a switch
            enabled = port_is_enabled(&p, name_buffer, buffer_size,
                                      base, runtime, true, walker, data);
            runtime = r.obj; // callback has stored the pointer of p here
        }
    }
    if(enabled)
        rtosc::walk_ports(p.ports, name_buffer, buffer_size,
                          data, walker, expand_bundles, runtime, ranges);
}